

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall FloatInterval_SumSquares_Test::TestBody(FloatInterval_SumSquares_Test *this)

{
  Interval<float> i;
  Interval<float> args_1;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FloatInterval c;
  FloatInterval b;
  FloatInterval a;
  Interval<float> in_stack_fffffffffffffe78;
  AssertHelper *in_stack_fffffffffffffe80;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  char *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  int iVar9;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined8 in_stack_fffffffffffffea8;
  Type type;
  AssertHelper *in_stack_fffffffffffffeb0;
  Interval<float> args;
  undefined7 in_stack_fffffffffffffeb8;
  Interval<float> in_stack_fffffffffffffec0;
  Interval<float> i_00;
  Message *in_stack_fffffffffffffef8;
  AssertHelper *in_stack_ffffffffffffff00;
  AssertHelper *this_02;
  AssertionResult local_f0 [2];
  Interval<float> local_d0;
  Interval<float> local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined4 local_b4;
  AssertionResult local_b0 [2];
  Interval<float> local_90;
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined1 local_78 [48];
  Interval<float> local_48;
  undefined8 local_40;
  float local_38;
  undefined4 local_34;
  undefined1 local_30 [16];
  Interval<float> local_20;
  Interval<float> local_18;
  Interval<float> local_10 [2];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  type = (Type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  pbrt::Interval<float>::Interval(local_10,1.0);
  pbrt::Interval<float>::Interval(&local_18,2.0);
  pbrt::Interval<float>::Interval(&local_20,3.0);
  local_34 = 1;
  local_48 = local_10[0];
  auVar5._0_8_ = pbrt::SumSquares<float>(in_stack_fffffffffffffe78);
  auVar5._8_56_ = extraout_var;
  local_40 = vmovlpd_avx(auVar5._0_16_);
  local_38 = pbrt::Interval::operator_cast_to_float((Interval<float> *)0x5f627d);
  i_00 = (Interval<float>)local_30;
  testing::internal::EqHelper<false>::Compare<int,float>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (int *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (float *)in_stack_fffffffffffffe80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)i_00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffec0 =
         (Interval<float>)testing::AssertionResult::failure_message((AssertionResult *)0x5f630a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffeb0,type,
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x5f6367);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f63bf);
  local_7c = 4;
  local_90 = local_18;
  auVar6._0_8_ = pbrt::SumSquares<float>(in_stack_fffffffffffffe78);
  auVar6._8_56_ = extraout_var_00;
  local_88 = vmovlpd_avx(auVar6._0_16_);
  local_80 = pbrt::Interval::operator_cast_to_float((Interval<float> *)0x5f63fe);
  args = (Interval<float>)local_78;
  testing::internal::EqHelper<false>::Compare<int,float>
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (int *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (float *)in_stack_fffffffffffffe80);
  iVar9 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)args);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)args);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x5f649d);
    type = (Type)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,type,
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),iVar9,
               in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x5f64fa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f6552);
  local_b4 = 5;
  local_c8 = local_10[0];
  local_d0 = local_18;
  i.high._3_1_ = uVar2;
  i._0_7_ = in_stack_fffffffffffffeb8;
  auVar7._0_8_ = pbrt::SumSquares<float,pbrt::Interval<float>>(i,args);
  auVar7._8_56_ = extraout_var_01;
  local_c0 = vmovlpd_avx(auVar7._0_16_);
  local_b8 = pbrt::Interval::operator_cast_to_float((Interval<float> *)0x5f65aa);
  this_01 = local_b0;
  testing::internal::EqHelper<false>::Compare<int,float>
            (&this_01->success_,in_stack_fffffffffffffe90,
             (int *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
             (float *)in_stack_fffffffffffffe80);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)args);
    in_stack_fffffffffffffe90 =
         testing::AssertionResult::failure_message((AssertionResult *)0x5f6649);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffffea0),
               (int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe80);
    testing::Message::~Message((Message *)0x5f66a6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f66fe);
  args_1.high._3_1_ = uVar2;
  args_1._0_7_ = in_stack_fffffffffffffeb8;
  auVar8._0_8_ = pbrt::SumSquares<float,pbrt::Interval<float>,pbrt::Interval<float>>
                           (i_00,in_stack_fffffffffffffec0,args_1);
  auVar8._8_56_ = extraout_var_02;
  this_02 = (AssertHelper *)vmovlpd_avx(auVar8._0_16_);
  pbrt::Interval::operator_cast_to_float((Interval<float> *)0x5f6763);
  this_00 = local_f0;
  testing::internal::EqHelper<false>::Compare<int,float>
            (&this_01->success_,in_stack_fffffffffffffe90,
             (int *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),(float *)this_00);
  iVar9 = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)args);
    testing::AssertionResult::failure_message((AssertionResult *)0x5f67ff);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)args,type,(char *)CONCAT17(uVar3,in_stack_fffffffffffffea0),iVar9,
               in_stack_fffffffffffffe90);
    testing::internal::AssertHelper::operator=(this_02,(Message *)local_10[0]);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x5f684b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5f689a);
  return;
}

Assistant:

TEST(FloatInterval, SumSquares) {
    {
        FloatInterval a(1), b(2), c(3);
        EXPECT_EQ(1, Float(SumSquares(a)));
        EXPECT_EQ(4, Float(SumSquares(b)));
        EXPECT_EQ(5, Float(SumSquares(a, b)));
        EXPECT_EQ(14, Float(SumSquares(a, b, c)));
    }
}